

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O2

int Pdr_ManCheckContainment(Pdr_Man_t *p,int k,Pdr_Set_t *pSet)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  Pdr_Set_t *pNew;
  int i;
  
  iVar1 = p->vSolvers->nSize;
  do {
    if (iVar1 <= k) {
      return 0;
    }
    p_00 = Vec_VecEntry(p->vClauses,k);
    i = 0;
    while (i < p_00->nSize) {
      pNew = (Pdr_Set_t *)Vec_PtrEntry(p_00,i);
      iVar2 = Pdr_SetContains(pSet,pNew);
      i = i + 1;
      if (iVar2 != 0) {
        return 1;
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

int Pdr_ManCheckContainment( Pdr_Man_t * p, int k, Pdr_Set_t * pSet )
{
    Pdr_Set_t * pThis;
    Vec_Ptr_t * vArrayK;
    int i, j, kMax = Vec_PtrSize(p->vSolvers)-1;
    Vec_VecForEachLevelStartStop( p->vClauses, vArrayK, i, k, kMax+1 )
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pThis, j )
            if ( Pdr_SetContains( pSet, pThis ) )
                return 1;
    return 0;
}